

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFallbackValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> *this;
  undefined1 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar8;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  Vector *pVVar12;
  STORAGE_TYPE *pSVar13;
  TemplatedValidityData<unsigned_long> *pTVar14;
  _Head_base<0UL,_unsigned_long_*,_false> _Var15;
  idx_t iVar16;
  idx_t iVar17;
  idx_t i;
  ulong uVar18;
  char **ppcVar19;
  long lVar20;
  ulong uVar21;
  string_t sVar22;
  UnifiedVectorFormat state_format;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  ulong local_a8;
  Vector *local_a0;
  long local_98;
  long local_90;
  idx_t local_88;
  unsigned_long local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_88 = offset;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar11 = duckdb::ListVector::GetListSize(result);
  if (count == 0) {
    lVar20 = 0;
  }
  else {
    lVar20 = 0;
    iVar16 = 0;
    do {
      iVar17 = iVar16;
      if (*local_78 != 0) {
        iVar17 = (idx_t)*(uint *)(*local_78 + iVar16 * 4);
      }
      lVar20 = lVar20 + *(long *)(*(long *)(local_70 + iVar17 * 8) + 0x10);
      iVar16 = iVar16 + 1;
    } while (count != iVar16);
  }
  local_90 = local_70;
  duckdb::ListVector::Reserve(result,lVar20 + uVar11);
  local_98 = *(long *)(result + 0x20);
  pVVar12 = (Vector *)duckdb::ListVector::GetEntry(result);
  if (count != 0) {
    local_a0 = result + 0x30;
    uVar18 = 0;
    local_a8 = count;
    do {
      uVar21 = uVar18;
      if (*local_78 != 0) {
        uVar21 = (ulong)*(uint *)(*local_78 + uVar18 * 4);
      }
      uVar2 = uVar18 + local_88;
      this = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> **)
              (local_90 + uVar21 * 8);
      if (((char)this[1].capacity == '\x01') && (iVar16 = this->size, iVar16 != 0)) {
        *(ulong *)(local_98 + uVar2 * 0x10) = uVar11;
        *(idx_t *)(local_98 + 8 + uVar2 * 0x10) = iVar16;
        pSVar13 = BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan>::
                  SortAndGetHeap(this);
        if (this->size != 0) {
          ppcVar19 = &(pSVar13->second).value.value.pointer.ptr;
          uVar21 = 0;
          do {
            paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar19 + -1);
            uVar3 = paVar1->length;
            uVar4 = paVar1->prefix[0];
            uVar5 = paVar1->prefix[1];
            uVar6 = paVar1->prefix[2];
            uVar7 = paVar1->prefix[3];
            sVar22.value.pointer.prefix[3] = uVar7;
            sVar22.value.pointer.prefix[2] = uVar6;
            sVar22.value.pointer.prefix[1] = uVar5;
            sVar22.value.pointer.prefix[0] = uVar4;
            sVar22.value.pointer.length = uVar3;
            sVar22.value.pointer.ptr = *ppcVar19;
            duckdb::CreateSortKeyHelpers::DecodeSortKey
                      (sVar22,pVVar12,uVar11 + uVar21,(OrderModifiers)0x302);
            uVar21 = uVar21 + 1;
            ppcVar19 = ppcVar19 + 8;
          } while (uVar21 < this->size);
          uVar11 = uVar11 + uVar21;
          count = local_a8;
        }
      }
      else {
        _Var15._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var15._M_head_impl == (unsigned_long *)0x0) {
          local_80 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_b8,&local_80);
          p_Var10 = p_Stack_b0;
          uVar9 = local_b8;
          local_b8 = 0;
          p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(undefined8 *)(result + 0x30) = uVar9;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
          }
          pTVar14 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               local_a0);
          _Var15._M_head_impl =
               (pTVar14->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var15._M_head_impl;
        }
        bVar8 = (byte)uVar2 & 0x3f;
        _Var15._M_head_impl[uVar2 >> 6] =
             _Var15._M_head_impl[uVar2 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != count);
  }
  duckdb::ListVector::SetListSize(result,uVar11);
  duckdb::Vector::Verify((ulong)result);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}